

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

Label __thiscall asmjit::v1_14::BaseAssembler::newLabel(BaseAssembler *this)

{
  Error EVar1;
  CodeHolder *in_RSI;
  LabelEntry **in_RDI;
  Label LVar2;
  Error err;
  LabelEntry *le;
  uint32_t labelId;
  LabelEntry **ppLVar3;
  long local_60;
  undefined4 local_54;
  
  local_54 = 0xffffffff;
  ppLVar3 = in_RDI;
  if (in_RSI->_logger != (Logger *)0x0) {
    EVar1 = CodeHolder::newLabelEntry(in_RSI,in_RDI);
    if (EVar1 == 0) {
      local_54 = *(undefined4 *)(local_60 + 0xc);
    }
    else {
      BaseEmitter::reportError((BaseEmitter *)in_RSI,(Error)((ulong)ppLVar3 >> 0x20),(char *)in_RDI)
      ;
    }
  }
  *(undefined4 *)in_RDI = 5;
  *(undefined4 *)((long)in_RDI + 4) = local_54;
  *(undefined4 *)(in_RDI + 1) = 0;
  *(undefined4 *)((long)in_RDI + 0xc) = 0;
  LVar2.super_Operand.super_Operand_._data[0] = 0;
  LVar2.super_Operand.super_Operand_._data[1] = 0;
  LVar2.super_Operand.super_Operand_._0_8_ = ppLVar3;
  return (Label)LVar2.super_Operand.super_Operand_;
}

Assistant:

Label BaseAssembler::newLabel() {
  uint32_t labelId = Globals::kInvalidId;
  if (ASMJIT_LIKELY(_code)) {
    LabelEntry* le;
    Error err = _code->newLabelEntry(&le);
    if (ASMJIT_UNLIKELY(err))
      reportError(err);
    else
      labelId = le->id();
  }
  return Label(labelId);
}